

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

void __thiscall
slang::ast::Compilation::parseParamOverrides
          (Compilation *this,flat_hash_map<std::string_view,_const_ConstantValue_*> *results)

{
  long lVar1;
  pointer pbVar2;
  size_t sVar3;
  uint uVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  byte bVar8;
  __index_type _Var9;
  bool bVar10;
  byte bVar11;
  uint uVar12;
  size_type __n;
  ScriptSession *this_00;
  NameSyntax *pNVar13;
  uint64_t hash;
  Diagnostic *this_01;
  char *pcVar14;
  basic_string_view<char,_std::char_traits<char>_> *pbVar15;
  char *pcVar16;
  ulong uVar17;
  ulong pos0;
  pointer this_02;
  undefined1 auVar18 [16];
  basic_string_view<char,_std::char_traits<char>_> text;
  try_emplace_args_t local_1251;
  basic_string_view<char,_std::char_traits<char>_> *local_1250;
  ConstantValue *local_1248;
  string_view name;
  string_view optView;
  ConstantValue cv;
  locator local_11a0;
  undefined1 local_1188 [16];
  undefined1 local_1178 [16];
  size_ctrl_type local_1168;
  Diagnostics localDiags;
  ScriptSession session;
  
  if ((this->options).paramOverrides.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->options).paramOverrides.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_1188 = (undefined1  [16])0x0;
    local_1178 = (undefined1  [16])0x0;
    local_1168.ml = 0;
    local_1168.size = 0;
    boost::unordered::
    unordered_flat_map<std::type_index,_std::any,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
    ::unordered_flat_map
              ((unordered_flat_map<std::type_index,_std::any,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                *)local_1188);
    ScriptSession::ScriptSession(&session,(Bag *)local_1188);
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
    ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                   *)local_1188);
    pbVar2 = (this->options).paramOverrides.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_1250 = (basic_string_view<char,_std::char_traits<char>_> *)results;
    for (this_02 = (this->options).paramOverrides.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_02 != pbVar2;
        this_02 = this_02 + 1) {
      __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (this_02,'=',0);
      if (__n == 0xffffffffffffffff) {
LAB_002a72f9:
        this_01 = Scope::addDiag(&((this->root)._M_t.
                                   super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                                   .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>.
                                  _M_head_impl)->super_Scope,(DiagCode)0xf000d,
                                 (SourceLocation)0xffffffffffffffff);
        Diagnostic::operator<<(this_01,this_02);
      }
      else {
        localDiags.super_SmallVector<slang::Diagnostic,_2UL>.
        super_SmallVectorBase<slang::Diagnostic>.data_ =
             (pointer)localDiags.super_SmallVector<slang::Diagnostic,_2UL>.
                      super_SmallVectorBase<slang::Diagnostic>.firstElement;
        localDiags.super_SmallVector<slang::Diagnostic,_2UL>.
        super_SmallVectorBase<slang::Diagnostic>.len = 0;
        localDiags.super_SmallVector<slang::Diagnostic,_2UL>.
        super_SmallVectorBase<slang::Diagnostic>.cap = 2;
        optView._M_str = (this_02->_M_dataplus)._M_p;
        optView._M_len = this_02->_M_string_length;
        name = std::basic_string_view<char,_std::char_traits<char>_>::substr(&optView,0,__n);
        this_00 = (ScriptSession *)name._M_len;
        pNVar13 = tryParseName(this,name,&localDiags);
        if (((pNVar13->super_ExpressionSyntax).super_SyntaxNode.kind != IdentifierName) ||
           (localDiags.super_SmallVector<slang::Diagnostic,_2UL>.
            super_SmallVectorBase<slang::Diagnostic>.len != 0)) {
LAB_002a72ec:
          SmallVectorBase<slang::Diagnostic>::cleanup
                    ((SmallVectorBase<slang::Diagnostic> *)&localDiags,(EVP_PKEY_CTX *)this_00);
          goto LAB_002a72f9;
        }
        text = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&optView,__n + 1,0xffffffffffffffff);
        this_00 = &session;
        ScriptSession::eval(&cv,this_00,text);
        _Var9 = cv.value.
                super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                .
                super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                .
                super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                .
                super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                .
                super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                .
                super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                ._M_index;
        if (cv.value.
            super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ._M_index == '\0') {
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)&cv);
          goto LAB_002a72ec;
        }
        local_1248 = TypedBumpAllocator<slang::ConstantValue>::emplace<slang::ConstantValue>
                               (&this->constantAllocator,&cv);
        hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                         ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                          results,&name);
        pos0 = hash >> ((byte)((basic_string_view<char,_std::char_traits<char>_> *)results)->_M_len
                       & 0x3f);
        lVar1 = (hash & 0xff) * 4;
        cVar5 = (&UNK_0043a38c)[lVar1];
        cVar6 = (&UNK_0043a38d)[lVar1];
        cVar7 = (&UNK_0043a38e)[lVar1];
        bVar8 = (&UNK_0043a38f)[lVar1];
        pcVar14 = (char *)0x0;
        uVar17 = pos0;
        do {
          sVar3 = ((basic_string_view<char,_std::char_traits<char>_> *)((long)results + 0x10))->
                  _M_len;
          pcVar16 = (char *)(sVar3 + uVar17 * 0x10);
          bVar11 = pcVar16[0xf];
          auVar18[0] = -(*pcVar16 == cVar5);
          auVar18[1] = -(pcVar16[1] == cVar6);
          auVar18[2] = -(pcVar16[2] == cVar7);
          auVar18[3] = -(pcVar16[3] == bVar8);
          auVar18[4] = -(pcVar16[4] == cVar5);
          auVar18[5] = -(pcVar16[5] == cVar6);
          auVar18[6] = -(pcVar16[6] == cVar7);
          auVar18[7] = -(pcVar16[7] == bVar8);
          auVar18[8] = -(pcVar16[8] == cVar5);
          auVar18[9] = -(pcVar16[9] == cVar6);
          auVar18[10] = -(pcVar16[10] == cVar7);
          auVar18[0xb] = -(pcVar16[0xb] == bVar8);
          auVar18[0xc] = -(pcVar16[0xc] == cVar5);
          auVar18[0xd] = -(pcVar16[0xd] == cVar6);
          auVar18[0xe] = -(pcVar16[0xe] == cVar7);
          auVar18[0xf] = -(bVar11 == bVar8);
          uVar12 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe);
          if (uVar12 != 0) {
            pcVar16 = ((basic_string_view<char,_std::char_traits<char>_> *)((long)results + 0x10))->
                      _M_str;
            do {
              uVar4 = 0;
              if (uVar12 != 0) {
                for (; (uVar12 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                }
              }
              pbVar15 = &name;
              bVar10 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                       operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                   *)results,pbVar15,
                                  (basic_string_view<char,_std::char_traits<char>_> *)
                                  (pcVar16 + (ulong)uVar4 * 0x18 + uVar17 * 0x168));
              if (bVar10) goto LAB_002a72b0;
              uVar12 = uVar12 - 1 & uVar12;
              results = (flat_hash_map<std::string_view,_const_ConstantValue_*> *)local_1250;
            } while (uVar12 != 0);
            bVar11 = *(byte *)(sVar3 + uVar17 * 0x10 + 0xf);
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bVar11) == 0) break;
          pcVar16 = pcVar14 + uVar17 + 1;
          pcVar14 = pcVar14 + 1;
          uVar17 = (ulong)pcVar16 & (ulong)local_1250->_M_str;
          results = (flat_hash_map<std::string_view,_const_ConstantValue_*> *)local_1250;
        } while (pcVar14 <= local_1250->_M_str);
        pbVar15 = local_1250;
        if (local_1250[2]._M_str < (char *)local_1250[2]._M_len) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ConstantValue_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ConstantValue_const*>>>
          ::
          unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::ConstantValue*>
                    (&local_11a0,
                     (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ConstantValue_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ConstantValue_const*>>>
                      *)local_1250,pos0,hash,&local_1251,&name,&local_1248);
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ConstantValue_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ConstantValue_const*>>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::ConstantValue*>
                    (&local_11a0,
                     (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ConstantValue_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ConstantValue_const*>>>
                      *)local_1250,hash,&local_1251,&name,&local_1248);
        }
LAB_002a72b0:
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&cv);
        SmallVectorBase<slang::Diagnostic>::cleanup
                  ((SmallVectorBase<slang::Diagnostic> *)&localDiags,(EVP_PKEY_CTX *)pbVar15);
        results = (flat_hash_map<std::string_view,_const_ConstantValue_*> *)local_1250;
        if (_Var9 == '\0') goto LAB_002a72f9;
      }
    }
    ScriptSession::~ScriptSession(&session);
  }
  return;
}

Assistant:

void Compilation::addGateType(const PrimitiveSymbol& prim) {
    SLANG_ASSERT(!isFrozen());
    SLANG_ASSERT(!prim.name.empty());
    gateMap.emplace(prim.name, &prim);
}